

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O2

int __thiscall CTcTokenizer::read_line_pp(CTcTokenizer *this)

{
  CTcTokString *this_00;
  utf8_ptr *this_01;
  tc_toktyp_t tVar1;
  char *pcVar2;
  char *pcVar3;
  ulong __n;
  int iVar4;
  wchar_t c;
  wchar_t wVar5;
  size_t sVar6;
  code *pcVar7;
  long *plVar8;
  
  iVar4 = read_line(this,0);
  if (iVar4 == -1) {
    return 1;
  }
  wVar5 = this->in_quote_;
  this_00 = &this->linebuf_;
  this->curbuf_ = this_00;
  this_01 = &this->p_;
  (this->p_).p_ = (this->linebuf_).buf_ + iVar4;
  while( true ) {
    c = utf8_ptr::getch(this_01);
    iVar4 = is_space(c);
    if (iVar4 == 0) break;
    utf8_ptr::inc(this_01);
  }
  if (((wVar5 == L'\0') && (wVar5 = utf8_ptr::getch(this_01), wVar5 == L'#')) &&
     (this->allow_pp_ != 0)) {
    utf8_ptr::inc(this_01);
    while ((this->str_->field_0x28 & 2) != 0) {
      pcVar2 = (this->p_).p_;
      pcVar3 = (this->linebuf_).buf_;
      iVar4 = read_line(this,1);
      if (iVar4 == -1) break;
      this->curbuf_ = this_00;
      (this->p_).p_ = (this->linebuf_).buf_ + ((int)pcVar2 - (int)pcVar3);
    }
    next_on_line(this);
    tVar1 = (this->curtok_).typ_;
    if (tVar1 == TOKT_EOF) {
      clear_linebuf(this);
    }
    else {
      pcVar2 = (this->curtok_).text_;
      __n = (this->curtok_).text_len_;
      if (tVar1 != TOKT_SYM) {
        log_error(0x2712,__n & 0xffffffff,pcVar2);
        clear_linebuf(this);
        return 0;
      }
      for (plVar8 = (long *)&read_line_pp::kwlist[0].field_0x18; pcVar3 = (char *)plVar8[-3],
          pcVar3 != (char *)0x0; plVar8 = plVar8 + 4) {
        sVar6 = strlen(pcVar3);
        if ((sVar6 == __n) && (iVar4 = bcmp(pcVar2,pcVar3,__n), iVar4 == 0)) {
          iVar4 = in_false_if(this);
          if ((iVar4 == 0) || ((int)plVar8[-2] != 0)) {
            pcVar7 = (code *)plVar8[-1];
            if (((ulong)pcVar7 & 1) != 0) {
              pcVar7 = *(code **)(pcVar7 + *(long *)(&this->field_0x0 + *plVar8) + -1);
            }
            (*pcVar7)();
          }
          else {
            clear_linebuf(this);
          }
          goto LAB_00217a69;
        }
      }
      log_error(0x2712,__n & 0xffffffff,pcVar2);
LAB_00217a69:
      this->in_quote_ = L'\0';
    }
  }
  else {
    iVar4 = in_false_if(this);
    if (iVar4 == 0) {
      if (this->in_quote_ != L'\0') {
        splice_string(this);
      }
      this->curbuf_ = this_00;
      (this->p_).p_ = (this->linebuf_).buf_;
      expand_macros_curline(this,1,0,0);
    }
    else {
      clear_linebuf(this);
      (this->expbuf_).buf_len_ = 0;
      if ((this->expbuf_).buf_size_ != 0) {
        *(this->expbuf_).buf_ = '\0';
      }
    }
    if ((undefined1  [3440])((undefined1  [3440])*this & (undefined1  [3440])0x4) ==
        (undefined1  [3440])0x0) {
      this->curbuf_ = &this->expbuf_;
      (this->p_).p_ = (this->expbuf_).buf_;
    }
    else {
      CTcTokString::copy(this_00,(EVP_PKEY_CTX *)(this->expbuf_).buf_,
                         (EVP_PKEY_CTX *)(this->expbuf_).buf_len_);
    }
  }
  return 0;
}

Assistant:

int CTcTokenizer::read_line_pp()
{
    /* 
     *   Read the next line from the input.  If that fails, return an end
     *   of file indication.  
     */
    int ofs = read_line(FALSE);
    if (ofs == -1)
        return 1;

    /* 
     *   before we process comments, note whether or not the line started
     *   out within a character string 
     */
    int started_in_string = (in_quote_ != '\0');
    
    /* set up our source pointer to the start of the new line */
    start_new_line(&linebuf_, ofs);

    /* skip leading whitespace */
    while (is_space(p_.getch()))
        p_.inc();
    
    /* 
     *   If this line begins with a '#', process the directive.  Ignore
     *   any initial '#' if the line started off in a string.  
     */
    if (!started_in_string && p_.getch() == '#' && allow_pp_)
    {
        struct pp_kw_def
        {
            const char *kw;
            int process_in_false_if;
            void (CTcTokenizer::*func)();
        };
        static pp_kw_def kwlist[] =
        {
            { "charset", FALSE, &CTcTokenizer::pp_charset },
            { "pragma",  FALSE, &CTcTokenizer::pp_pragma },
            { "include", FALSE, &CTcTokenizer::pp_include },
            { "define",  FALSE, &CTcTokenizer::pp_define },
            { "if",      TRUE,  &CTcTokenizer::pp_if },
            { "ifdef",   TRUE,  &CTcTokenizer::pp_ifdef },
            { "ifndef",  TRUE,  &CTcTokenizer::pp_ifndef },
            { "else",    TRUE,  &CTcTokenizer::pp_else },
            { "elif",    TRUE,  &CTcTokenizer::pp_elif },
            { "endif",   TRUE,  &CTcTokenizer::pp_endif },
            { "error",   FALSE, &CTcTokenizer::pp_error },
            { "undef",   FALSE, &CTcTokenizer::pp_undef },
            { "line",    FALSE, &CTcTokenizer::pp_line },
            { 0, 0, 0 }
        };
        pp_kw_def *kwp;
        const char *kwtxt;
        size_t kwlen;
        
        /* skip the '#' */
        p_.inc();
        
        /*
         *   If the line ended inside a comment, read the next line until
         *   we're no longer in a comment.  The ANSI C preprocessor rules
         *   say that a newline in a comment should not be treated as a
         *   lexical newline, so pretend that the next line is part of the
         *   preprocessor line in such a case. 
         */
        while (str_->is_in_comment())
        {
            size_t p_ofs;

            /* remember the current offset in the line buffer */
            p_ofs = p_.getptr() - linebuf_.get_buf();

            /* append another line - stop at the end of the stream */
            if (read_line(TRUE) == -1)
                break;

            /* restore the line pointer, in case the buffer moved */
            start_new_line(&linebuf_, p_ofs);
        }
        
        /* read the directive */
        next_on_line();

        /* 
         *   if we've reached the end of the line, it's a null directive;
         *   simply return an empty line 
         */
        if (curtok_.gettyp() == TOKT_EOF)
        {
            clear_linebuf();
            return 0;
        }

        /* get the text and length of the keyword */
        kwtxt = curtok_.get_text();
        kwlen = curtok_.get_text_len();

        /* if it's not a symbol, it's not a valid directive */
        if (curtok_.gettyp() != TOKT_SYM)
        {
            /* log the error and return an empty line */
            log_error(TCERR_INV_PP_DIR, (int)kwlen, kwtxt);
            clear_linebuf();
            return 0;
        }
        
        /* determine which keyword we have, and process it */
        for (kwp = kwlist ; kwp->kw != 0 ; ++kwp)
        {
            /* is this our keyword? */
            if (strlen(kwp->kw) == kwlen
                && memcmp(kwtxt, kwp->kw, kwlen) == 0)
            {
                /*
                 *   This is our directive.
                 *   
                 *   If we're in the false branch of a #if block, only
                 *   process the directive if it's a kind of directive
                 *   that we should process in false #if branches.  The
                 *   only directives that we process in #if branches are
                 *   those that would affect the #if branching, such as a
                 *   #endif or a nested #if.  
                 */
                if (!in_false_if() || kwp->process_in_false_if)
                {
                    /* invoke the handler to process the directive */
                    (this->*(kwp->func))();
                }
                else
                {
                    /* 
                     *   we're in a #if branch not taken - simply clear
                     *   the buffer 
                     */
                    clear_linebuf();
                }
                
                /* we don't need to look any further */
                break;
            }
        }

        /* 
         *   if we didn't find the keyword, log an error and otherwise
         *   ignore the entire line 
         */
        if (kwp->kw == 0)
            log_error(TCERR_INV_PP_DIR, (int)kwlen, kwtxt);
        
        /*
         *   Preprocessor lines must always be entirely self-contained.
         *   Therefore, it's not valid for a string to start on a
         *   preprocessor line and continue onto subsequent lines.  If
         *   we're marked as being inside a string, there must have been
         *   an error on the preprocessor line.  Simply clear the
         *   in-string flag; we don't need to issue an error at this
         *   point, since the preprocessor line handler should have
         *   already caught the problem and reported an error.  
         */
        in_quote_ = '\0';
    }
    else
    {
        /*
         *   There's no preprocessor directive.
         *   
         *   If we're in a false #if branch, return an empty line.  We
         *   return an empty line rather than skipping to the next line so
         *   that the caller sees the same number of lines as are in the
         *   original source.  
         */
        if (in_false_if())
        {
            /* 
             *   it's a #if not taken - we don't want to compile the line
             *   at all, so just clear it out 
             */
            clear_linebuf();
            expbuf_.clear_text();
        }
        else
        {
            /*
             *   If we ended the line in a string, splice additional lines
             *   onto the end of this line until we find the end of the
             *   string, then unsplice the part after the end of the
             *   string. 
             */
            if (in_quote_ != '\0')
            {
                /* splice additional lines to finish the quote */
                splice_string();
            }
            
            /*
             *   Expand macros in the line, splicing additional source
             *   lines if necessary to fill out any incomplete actual
             *   parameter lists.  
             */
            start_new_line(&linebuf_, 0);
            expand_macros_curline(TRUE, FALSE, FALSE);
        }

        /* store the line in the appropriate place */
        if (pp_only_mode_)
        {
            /* 
             *   we're only preprocessing - store the macro-expanded line
             *   back in the line buffer so that the caller can read out
             *   the final preprocessed text 
             */
            linebuf_.copy(expbuf_.get_text(), expbuf_.get_text_len());
        }
        else
        {
            /* 
             *   We're compiling - simply read subsequent tokens out of
             *   the expansion buffer.  
             */
            start_new_line(&expbuf_, 0);
        }
    }

    /* return success */
    return 0;
}